

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_thread.hpp
# Opt level: O3

void boost::threadpool::detail::
     worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
     ::create_and_attach(shared_ptr<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
                         *pool)

{
  uint_least32_t *puVar1;
  sp_counted_base *psVar2;
  sp_counted_base *psVar3;
  worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *p;
  thread *this;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  worker;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  local_60;
  element_type *local_50;
  shared_count local_48;
  bind_t<void,_boost::_mfi::mf0<void,_boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>_>
  local_40;
  
  p = (worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
       *)operator_new(0x30);
  (p->
  super_enable_shared_from_this<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  ).weak_this_.px = (element_type *)0x0;
  (p->
  super_enable_shared_from_this<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>
  ).weak_this_.pn.pi_ = (sp_counted_base *)0x0;
  psVar3 = (pool->pn).pi_;
  psVar2 = (pool->pn).pi_;
  (p->m_pool).px = pool->px;
  (p->m_pool).pn.pi_ = psVar3;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    puVar1 = &psVar2->use_count_;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
  }
  (p->m_thread).px = (element_type *)0x0;
  (p->m_thread).pn.pi_ = (sp_counted_base *)0x0;
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
  ::
  shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
            ((shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>
              *)&local_50,p);
  if (local_50 != (element_type *)0x0) {
    this = (thread *)operator_new(0x10);
    local_60.px = local_50;
    local_60.pn.pi_ = local_48.pi_;
    if (local_48.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
      UNLOCK();
    }
    bind<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>,boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>>
              (&local_40,(boost *)run,0,&local_60);
    thread::
    thread<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,boost::threadpool::fifo_scheduler,boost::threadpool::static_size,boost::threadpool::resize_controller,boost::threadpool::wait_for_all_tasks>>>>>>>
              (this,&local_40);
    shared_ptr<boost::thread>::reset<boost::thread>(&local_50->m_thread,this);
    boost::detail::shared_count::~shared_count
              (&local_40.l_.
                super_storage1<boost::_bi::value<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
                .a1_.t_.pn);
    boost::detail::shared_count::~shared_count(&local_60.pn);
  }
  boost::detail::shared_count::~shared_count(&local_48);
  return;
}

Assistant:

static void create_and_attach(shared_ptr<pool_type> const & pool)
	  {
		  shared_ptr<worker_thread> worker(new worker_thread(pool));
		  if(worker)
		  {
			  worker->m_thread.reset(new boost::thread(bind(&worker_thread::run, worker)));
		  }
	  }